

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StreamingConcatenationExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_long&,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,unsigned_long *args_1,unsigned_long *args_2,
          span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
          *args_3,SourceRange *args_4)

{
  uint64_t uVar1;
  uint64_t uVar2;
  pointer pSVar3;
  size_t sVar4;
  SourceLocation SVar5;
  SourceLocation SVar6;
  StreamingConcatenationExpression *pSVar7;
  
  pSVar7 = (StreamingConcatenationExpression *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StreamingConcatenationExpression *)this->endPtr < pSVar7 + 1) {
    pSVar7 = (StreamingConcatenationExpression *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pSVar7 + 1);
  }
  uVar1 = *args_1;
  uVar2 = *args_2;
  pSVar3 = args_3->_M_ptr;
  sVar4 = (args_3->_M_extent)._M_extent_value;
  SVar5 = args_4->startLoc;
  SVar6 = args_4->endLoc;
  (pSVar7->super_Expression).kind = Streaming;
  (pSVar7->super_Expression).type.ptr = args;
  (pSVar7->super_Expression).constant = (ConstantValue *)0x0;
  (pSVar7->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pSVar7->super_Expression).sourceRange.startLoc = SVar5;
  (pSVar7->super_Expression).sourceRange.endLoc = SVar6;
  (pSVar7->streams_)._M_ptr = pSVar3;
  (pSVar7->streams_)._M_extent._M_extent_value = sVar4;
  pSVar7->sliceSize = uVar1;
  pSVar7->bitstreamWidth = uVar2;
  return pSVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }